

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall Lowerer::SplitBailOnImplicitCall(Lowerer *this,Instr **instr)

{
  Instr *this_00;
  code *pcVar1;
  bool bVar2;
  BailOutKind BVar3;
  int iVar4;
  undefined4 *puVar5;
  Opnd *opnd;
  IntConstOpnd *opnd_00;
  undefined4 extraout_var;
  Opnd *dstOpnd;
  IntConstOpnd *pIVar6;
  Instr *pIVar7;
  Instr *instr_00;
  Instr *instr_01;
  undefined1 local_68 [8];
  AutoReuseOpnd autoReuseImplicitCallFlags;
  AutoReuseOpnd autoReuseNoImplicitCall;
  
  bVar2 = IR::Instr::IsPlainInstr(*instr);
  pIVar7 = *instr;
  if ((!bVar2) && (pIVar7->m_kind != InstrKindProfiled)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x360f,"(instr->IsPlainInstr() || instr->IsProfiledInstr())",
                       "instr->IsPlainInstr() || instr->IsProfiledInstr()");
    if (!bVar2) goto LAB_00577961;
    *puVar5 = 0;
    pIVar7 = *instr;
  }
  BVar3 = IR::Instr::GetBailOutKind(pIVar7);
  if ((BVar3 & ~(BailOutKindBits|BailOutIntOnly)) != BailOutOnImplicitCalls) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3612,"(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind))",
                       "BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind)");
    if (!bVar2) goto LAB_00577961;
    *puVar5 = 0;
  }
  opnd = GetImplicitCallFlagsOpnd(this);
  IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)local_68,opnd,(*instr)->m_func,true);
  opnd_00 = IR::IntConstOpnd::New(1,TyInt8,this->m_func,true);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete,&opnd_00->super_Opnd,
             (*instr)->m_func,true);
  InsertMove(opnd,&opnd_00->super_Opnd,*instr,true);
  if ((BVar3 & ~LazyBailOut) == BailOutOnImplicitCallsPreOp) {
    iVar4 = (*(*instr)->m_func->m_threadContextInfo->_vptr_ThreadContextInfo[4])();
    dstOpnd = LowererMD::GenerateMemRef
                        (&this->m_lowererMD,CONCAT44(extraout_var,iVar4),TyInt8,*instr,false);
    pIVar6 = IR::IntConstOpnd::New(1,TyInt8,(*instr)->m_func,true);
    pIVar7 = IR::Instr::New(Ld_A,dstOpnd,&pIVar6->super_Opnd,(*instr)->m_func);
    IR::Instr::InsertBefore(*instr,pIVar7);
    pIVar6 = IR::IntConstOpnd::New(0,TyInt8,(*instr)->m_func,true);
    instr_00 = IR::Instr::New(Ld_A,dstOpnd,&pIVar6->super_Opnd,(*instr)->m_func);
    instr_00->m_noLazyHelperAssert = true;
  }
  else {
    pIVar7 = (Instr *)0x0;
    instr_00 = (Instr *)0x0;
  }
  this_00 = *instr;
  instr_01 = IR::Instr::New(this_00->m_opcode,this_00->m_func);
  *instr = instr_01;
  IR::Instr::TransferTo(this_00,instr_01);
  IR::Instr::InsertBefore(this_00,*instr);
  if (pIVar7 != (Instr *)0x0) {
    if (instr_00 == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3644,"(enableImplicitCallsInstr)","enableImplicitCallsInstr");
      if (!bVar2) {
LAB_00577961:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    IR::Instr::InsertBefore(this_00,instr_00);
    LowererMD::ChangeToAssign(pIVar7);
    LowererMD::ChangeToAssign(instr_00);
  }
  this_00->m_opcode = BailOnNotEqual;
  IR::Instr::SetSrc1(this_00,opnd);
  IR::Instr::SetSrc2(this_00,&opnd_00->super_Opnd);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&autoReuseImplicitCallFlags.autoDelete);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_68);
  return this_00;
}

Assistant:

IR::Instr *
Lowerer::SplitBailOnImplicitCall(IR::Instr *& instr)
{
    Assert(instr->IsPlainInstr() || instr->IsProfiledInstr());

    const auto bailOutKind = instr->GetBailOutKind();
    Assert(BailOutInfo::IsBailOutOnImplicitCalls(bailOutKind));

    IR::Opnd * implicitCallFlags = this->GetImplicitCallFlagsOpnd();
    const IR::AutoReuseOpnd autoReuseImplicitCallFlags(implicitCallFlags, instr->m_func);
    IR::IntConstOpnd * noImplicitCall = IR::IntConstOpnd::New(Js::ImplicitCall_None, TyInt8, this->m_func, true);
    const IR::AutoReuseOpnd autoReuseNoImplicitCall(noImplicitCall, instr->m_func);

    // Reset the implicit call flag on every helper call
    Lowerer::InsertMove(implicitCallFlags, noImplicitCall, instr);

    IR::Instr *disableImplicitCallsInstr = nullptr, *enableImplicitCallsInstr = nullptr;
    if(BailOutInfo::WithoutLazyBailOut(bailOutKind) == IR::BailOutOnImplicitCallsPreOp)
    {
        const auto disableImplicitCallAddress =
            m_lowererMD.GenerateMemRef(
                instr->m_func->GetThreadContextInfo()->GetDisableImplicitFlagsAddr(),
                TyInt8,
                instr);

        // Disable implicit calls since they will be called after bailing out
        disableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitCallFlag, TyInt8, instr->m_func, true),
                instr->m_func);
        instr->InsertBefore(disableImplicitCallsInstr);

        // Create instruction for re-enabling implicit calls
        enableImplicitCallsInstr =
            IR::Instr::New(
                Js::OpCode::Ld_A,
                disableImplicitCallAddress,
                IR::IntConstOpnd::New(DisableImplicitNoFlag, TyInt8, instr->m_func, true),
                instr->m_func);

#if DBG
        enableImplicitCallsInstr->m_noLazyHelperAssert = true;
#endif
    }

    IR::Instr * bailOutInstr = instr;

    instr = IR::Instr::New(instr->m_opcode, instr->m_func);
    bailOutInstr->TransferTo(instr);
    bailOutInstr->InsertBefore(instr);

    if(disableImplicitCallsInstr)
    {
        // Re-enable implicit calls
        Assert(enableImplicitCallsInstr);
        bailOutInstr->InsertBefore(enableImplicitCallsInstr);

        // Lower both instructions. Lowering an instruction may free the instruction's original operands, so do that last.
        LowererMD::ChangeToAssign(disableImplicitCallsInstr);
        LowererMD::ChangeToAssign(enableImplicitCallsInstr);
    }

    bailOutInstr->m_opcode = Js::OpCode::BailOnNotEqual;

    bailOutInstr->SetSrc1(implicitCallFlags);
    bailOutInstr->SetSrc2(noImplicitCall);

    return bailOutInstr;
}